

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_csv_parser.hpp
# Opt level: O0

CSVRow * __thiscall
csv::internals::ThreadSafeDeque<csv::CSVRow>::pop_front
          (CSVRow *__return_storage_ptr__,ThreadSafeDeque<csv::CSVRow> *this)

{
  reference pvVar1;
  lock_guard<std::mutex> local_20;
  lock_guard<std::mutex> lock;
  ThreadSafeDeque<csv::CSVRow> *this_local;
  CSVRow *item;
  
  lock._M_device = (mutex_type *)this;
  std::lock_guard<std::mutex>::lock_guard(&local_20,&this->_lock);
  pvVar1 = std::deque<csv::CSVRow,_std::allocator<csv::CSVRow>_>::front(&this->data);
  CSVRow::CSVRow(__return_storage_ptr__,pvVar1);
  std::deque<csv::CSVRow,_std::allocator<csv::CSVRow>_>::pop_front(&this->data);
  std::lock_guard<std::mutex>::~lock_guard(&local_20);
  return __return_storage_ptr__;
}

Assistant:

T pop_front() noexcept {
                std::lock_guard<std::mutex> lock{ this->_lock };
                T item = std::move(data.front());
                data.pop_front();
                return item;
            }